

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joinside.cpp
# Opt level: O2

JoinSide duckdb::JoinSide::GetJoinSide
                   (unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                    *bindings,
                   unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *left_bindings,
                   unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *right_bindings)

{
  JoinSide JVar1;
  JoinSide JVar2;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  *extraout_RDX;
  JoinValue JVar3;
  __node_base *p_Var4;
  
  p_Var4 = &(bindings->_M_h)._M_before_begin;
  JVar1.value = NONE;
  while( true ) {
    JVar3 = JVar1.value;
    p_Var4 = p_Var4->_M_nxt;
    if (p_Var4 == (__node_base *)0x0) break;
    JVar2 = GetJoinSide((idx_t)p_Var4[1]._M_nxt,left_bindings,right_bindings);
    right_bindings = extraout_RDX;
    JVar1 = JVar2;
    if (((JVar3 != NONE) && (JVar1.value = JVar3, JVar2.value != NONE)) && (JVar3 != JVar2.value)) {
      JVar1.value = BOTH;
    }
  }
  return (JoinSide)JVar3;
}

Assistant:

JoinSide JoinSide::GetJoinSide(const unordered_set<idx_t> &bindings, const unordered_set<idx_t> &left_bindings,
                               const unordered_set<idx_t> &right_bindings) {
	JoinSide side = JoinSide::NONE;
	for (auto binding : bindings) {
		side = CombineJoinSide(side, GetJoinSide(binding, left_bindings, right_bindings));
	}
	return side;
}